

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

void __thiscall cali::Caliper::begin(Caliper *this,Attribute *attr,Variant *data)

{
  pointer pCVar1;
  uint prop;
  Channel *channel;
  pointer pCVar2;
  mutex *__mutex;
  element_type *local_50;
  Caliper *local_48;
  uint local_3c;
  ThreadData *local_38;
  
  if (this->sT->stack_error == false) {
    local_3c = Attribute::properties(attr);
    local_38 = this->sT;
    (local_38->lock).m_lock = (local_38->lock).m_lock + 1;
    if ((local_3c & 0x40) == 0) {
      pCVar1 = (this->sG->active_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar2 = (this->sG->active_channels).
                    super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
        local_50 = (pCVar2->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        local_48 = this;
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(local_50->events).pre_begin_evt,&local_48,&local_50,attr,data);
      }
    }
    prop = local_3c;
    if ((local_3c & 0x3c) == 0xc) {
      __mutex = &this->sG->process_blackboard_lock;
      std::mutex::lock(__mutex);
      anon_unknown.dwarf_36ee15::handle_begin
                (attr,data,prop,&this->sG->process_blackboard,&this->sT->tree);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else if ((local_3c & 0x3c) == 0x14) {
      anon_unknown.dwarf_36ee15::handle_begin
                (attr,data,local_3c,&this->sT->thread_blackboard,&this->sT->tree);
    }
    if ((prop & 0x40) == 0) {
      pCVar1 = (this->sG->active_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar2 = (this->sG->active_channels).
                    super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
        local_50 = (pCVar2->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        local_48 = this;
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(local_50->events).post_begin_evt,&local_48,&local_50,attr,data);
      }
    }
    (local_38->lock).m_lock = (local_38->lock).m_lock + -1;
  }
  return;
}

Assistant:

void Caliper::begin(const Attribute& attr, const Variant& data)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    std::lock_guard<::siglock> g(sT->lock);

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_begin_evt(this, channel.body(), attr, data);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_begin(attr, data, prop, sT->thread_blackboard, sT->tree);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_begin(attr, data, prop, sG->process_blackboard, sT->tree);
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.post_begin_evt(this, channel.body(), attr, data);
}